

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_fs_read_dir(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  char buf [2];
  
  ::loop = (uv_loop_t *)uv_default_loop();
  rmdir("test_dir");
  iVar1 = uv_fs_mkdir(::loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar1 == 0) {
    uv_run(::loop,0);
    if (mkdir_cb_count == 1) {
      iVar1 = uv_fs_open(::loop,&open_req1,"test_dir",0x10000,0x180,0);
      if (iVar1 < 0) {
        pcVar3 = "r >= 0";
        uVar2 = 0xdea;
      }
      else {
        uv_fs_req_cleanup(&open_req1);
        iov = (uv_buf_t)uv_buf_init(buf,2);
        iVar1 = uv_fs_read(0,&read_req,(undefined4)open_req1.result,&iov,1,0,0);
        if (iVar1 == -0x15) {
          uv_fs_req_cleanup(&read_req);
          iVar1 = uv_fs_close(0,&close_req,(undefined4)open_req1.result,0);
          if (iVar1 == 0) {
            uv_fs_req_cleanup(&close_req);
            rmdir("test_dir");
            loop = (uv_loop_t *)uv_default_loop();
            close_loop(loop);
            uVar2 = uv_default_loop();
            iVar1 = uv_loop_close(uVar2);
            if (iVar1 == 0) {
              uv_library_shutdown();
              return 0;
            }
            pcVar3 = "0 == uv_loop_close(uv_default_loop())";
            uVar2 = 0xe09;
          }
          else {
            pcVar3 = "r == 0";
            uVar2 = 0xe03;
          }
        }
        else {
          pcVar3 = "r == UV_EISDIR";
          uVar2 = 0xdfe;
        }
      }
    }
    else {
      pcVar3 = "mkdir_cb_count == 1";
      uVar2 = 0xde0;
    }
  }
  else {
    pcVar3 = "r == 0";
    uVar2 = 0xdde;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
          uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(fs_read_dir) {
  int r;
  char buf[2];
  loop = uv_default_loop();

  /* Setup */
  rmdir("test_dir");
  r = uv_fs_mkdir(loop, &mkdir_req, "test_dir", 0755, mkdir_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(mkdir_cb_count == 1);
  /* Setup Done Here */

  /* Get a file descriptor for the directory */
  r = uv_fs_open(loop,
                 &open_req1,
                 "test_dir",
                 UV_FS_O_RDONLY | UV_FS_O_DIRECTORY,
                 S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r >= 0);
  uv_fs_req_cleanup(&open_req1);

  /* Try to read data from the directory */
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &read_req, open_req1.result, &iov, 1, 0, NULL);
#if defined(__FreeBSD__)   || \
    defined(__OpenBSD__)   || \
    defined(__NetBSD__)    || \
    defined(__DragonFly__) || \
    defined(_AIX)          || \
    defined(__sun)         || \
    defined(__MVS__)
  /*
   * As of now, these operating systems support reading from a directory,
   * that too depends on the filesystem this temporary test directory is
   * created on. That is why this assertion is a bit lenient.
   */
  ASSERT((r >= 0) || (r == UV_EISDIR));
#else
  ASSERT(r == UV_EISDIR);
#endif
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  rmdir("test_dir");

  MAKE_VALGRIND_HAPPY();
  return 0;
}